

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 aVar1;
  string *psVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  int i;
  ulong uVar7;
  LogMessageFatal local_30 [16];
  
  aVar1 = this->location_->field_0;
  if (((undefined1  [96])aVar1 & (undefined1  [96])0x1) == (undefined1  [96])0x0) {
    if (((undefined1  [96])aVar1 & (undefined1  [96])0x2) == (undefined1  [96])0x0) {
      if (leading->_M_string_length != 0) {
        psVar2 = SourceCodeInfo_Location::_internal_mutable_leading_comments_abi_cxx11_
                           (this->location_);
        std::__cxx11::string::swap((string *)psVar2);
      }
      if (trailing->_M_string_length != 0) {
        psVar2 = SourceCodeInfo_Location::_internal_mutable_trailing_comments_abi_cxx11_
                           (this->location_);
        std::__cxx11::string::swap((string *)psVar2);
      }
      for (uVar7 = 0;
          uVar7 < (ulong)((long)(detached_comments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(detached_comments->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
      {
        psVar3 = (string *)
                 internal::RepeatedPtrFieldBase::AddString
                           (&(this->location_->field_0)._impl_.leading_detached_comments_.
                             super_RepeatedPtrFieldBase);
        std::__cxx11::string::swap(psVar3);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(detached_comments);
      return;
    }
    pcVar6 = "!location_->has_trailing_comments()";
    uVar4 = 0x23;
    uVar5 = 0x1f7;
  }
  else {
    pcVar6 = "!location_->has_leading_comments()";
    uVar4 = 0x22;
    uVar5 = 0x1f6;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
             ,uVar5,uVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  ABSL_CHECK(!location_->has_leading_comments());
  ABSL_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}